

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_scale_test.cc
# Opt level: O3

void anon_unknown.dwarf_29ca355::PrepBuffers<unsigned_short>
               (ACMRandom *rnd,int w,int h,int stride,int bd,bool trash_edges,unsigned_short *data)

{
  unsigned_short *puVar1;
  ushort uVar2;
  uint32_t uVar3;
  ulong uVar4;
  int i;
  int iVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  unsigned_short *puVar9;
  unsigned_short *puVar10;
  
  FillEdge<unsigned_short>(rnd,stride << 5,bd,trash_edges,data);
  if (0 < h) {
    uVar2 = ~(ushort)(-1 << ((byte)bd & 0x1f));
    lVar8 = (long)stride;
    puVar10 = data + lVar8 * 0x20;
    puVar9 = data + (long)w + lVar8 * 0x20 + 0x20;
    uVar4 = 0;
    do {
      puVar1 = data + (uVar4 + 0x20) * lVar8;
      if (trash_edges) {
        lVar6 = 0;
        do {
          uVar3 = testing::internal::Random::Generate(&rnd->random_,0x80000000);
          puVar10[lVar6] = (ushort)(uVar3 >> 0xf) & uVar2;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0x20);
      }
      else {
        puVar1[0x18] = 0;
        puVar1[0x19] = 0;
        puVar1[0x1a] = 0;
        puVar1[0x1b] = 0;
        puVar1[0x1c] = 0;
        puVar1[0x1d] = 0;
        puVar1[0x1e] = 0;
        puVar1[0x1f] = 0;
        puVar1[0x10] = 0;
        puVar1[0x11] = 0;
        puVar1[0x12] = 0;
        puVar1[0x13] = 0;
        puVar1[0x14] = 0;
        puVar1[0x15] = 0;
        puVar1[0x16] = 0;
        puVar1[0x17] = 0;
        puVar1[8] = 0;
        puVar1[9] = 0;
        puVar1[10] = 0;
        puVar1[0xb] = 0;
        puVar1[0xc] = 0;
        puVar1[0xd] = 0;
        puVar1[0xe] = 0;
        puVar1[0xf] = 0;
        puVar1[0] = 0;
        puVar1[1] = 0;
        puVar1[2] = 0;
        puVar1[3] = 0;
        puVar1[4] = 0;
        puVar1[5] = 0;
        puVar1[6] = 0;
        puVar1[7] = 0;
      }
      if (0 < w) {
        uVar7 = 0;
        do {
          uVar3 = testing::internal::Random::Generate(&rnd->random_,0x80000000);
          puVar10[uVar7 + 0x20] = (ushort)(uVar3 >> 0xf) & uVar2;
          uVar7 = uVar7 + 1;
        } while ((uint)w != uVar7);
      }
      if (trash_edges) {
        lVar6 = 0;
        do {
          uVar3 = testing::internal::Random::Generate(&rnd->random_,0x80000000);
          puVar9[lVar6] = (ushort)(uVar3 >> 0xf) & uVar2;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0x20);
      }
      else {
        puVar1 = puVar1 + (long)w + 0x20;
        puVar1[0x18] = 0;
        puVar1[0x19] = 0;
        puVar1[0x1a] = 0;
        puVar1[0x1b] = 0;
        puVar1[0x1c] = 0;
        puVar1[0x1d] = 0;
        puVar1[0x1e] = 0;
        puVar1[0x1f] = 0;
        puVar1[0x10] = 0;
        puVar1[0x11] = 0;
        puVar1[0x12] = 0;
        puVar1[0x13] = 0;
        puVar1[0x14] = 0;
        puVar1[0x15] = 0;
        puVar1[0x16] = 0;
        puVar1[0x17] = 0;
        puVar1[8] = 0;
        puVar1[9] = 0;
        puVar1[10] = 0;
        puVar1[0xb] = 0;
        puVar1[0xc] = 0;
        puVar1[0xd] = 0;
        puVar1[0xe] = 0;
        puVar1[0xf] = 0;
        puVar1[0] = 0;
        puVar1[1] = 0;
        puVar1[2] = 0;
        puVar1[3] = 0;
        puVar1[4] = 0;
        puVar1[5] = 0;
        puVar1[6] = 0;
        puVar1[7] = 0;
      }
      uVar4 = uVar4 + 1;
      puVar10 = puVar10 + lVar8;
      puVar9 = puVar9 + lVar8;
    } while (uVar4 != (uint)h);
  }
  FillEdge<unsigned_short>(rnd,stride << 5,bd,trash_edges,data + (h + 0x20) * stride);
  iVar5 = (h + 0x40) * stride;
  memcpy(data + iVar5,data,(long)(iVar5 * 2));
  return;
}

Assistant:

void PrepBuffers(ACMRandom *rnd, int w, int h, int stride, int bd,
                 bool trash_edges, Pixel *data) {
  assert(rnd);
  const Pixel mask = (1 << bd) - 1;

  // Fill in the first buffer with random data
  // Top border
  FillEdge(rnd, stride * kVPad, bd, trash_edges, data);
  for (int r = 0; r < h; ++r) {
    Pixel *row_data = data + (kVPad + r) * stride;
    // Left border, contents, right border
    FillEdge(rnd, kHPad, bd, trash_edges, row_data);
    for (int c = 0; c < w; ++c) row_data[kHPad + c] = rnd->Rand16() & mask;
    FillEdge(rnd, kHPad, bd, trash_edges, row_data + kHPad + w);
  }
  // Bottom border
  FillEdge(rnd, stride * kVPad, bd, trash_edges, data + stride * (kVPad + h));

  const int bpp = sizeof(*data);
  const int block_elts = stride * (h + 2 * kVPad);
  const int block_size = bpp * block_elts;

  // Now copy that to the second buffer
  memcpy(data + block_elts, data, block_size);
}